

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_location.c
# Opt level: O3

cio_error cio_http_location_init
                    (cio_http_location *location,char *path,void *config,
                    cio_http_alloc_handler_t handler)

{
  cio_error cVar1;
  
  cVar1 = CIO_INVALID_ARGUMENT;
  if (((location != (cio_http_location *)0x0) && (path != (char *)0x0)) &&
     (handler != (cio_http_alloc_handler_t)0x0)) {
    location->config = config;
    location->next = (cio_http_location *)0x0;
    location->alloc_handler = handler;
    location->path = path;
    cVar1 = CIO_SUCCESS;
  }
  return cVar1;
}

Assistant:

enum cio_error cio_http_location_init(struct cio_http_location *location, const char *path, const void *config, cio_http_alloc_handler_t handler)
{
	if (cio_unlikely((location == NULL) || (path == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	location->config = config;
	location->next = NULL;
	location->alloc_handler = handler;
	location->path = path;

	return CIO_SUCCESS;
}